

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O2

REF_STATUS ref_export_bin_ugrid(REF_GRID ref_grid,char *filename,REF_BOOL swap,REF_BOOL fat)

{
  REF_NODE ref_node;
  REF_DBL RVar1;
  REF_CELL pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  REF_INT RVar5;
  FILE *__stream;
  size_t sVar6;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int local_104;
  int local_100;
  int local_f8;
  REF_DBL local_e8;
  REF_INT *n2o;
  REF_INT *o2n;
  long local_d0;
  long local_c8;
  REF_CELL *local_c0;
  REF_CELL *local_b8;
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x62d,
           "ref_export_bin_ugrid","unable to open file");
    return 2;
  }
  uVar3 = ref_export_bin_ugrid_int((FILE *)__stream,swap,fat,ref_node->n);
  if (uVar3 == 0) {
    RVar4 = ref_export_bin_ugrid_int((FILE *)__stream,swap,fat,ref_grid->cell[3]->n);
    if (RVar4 == 0) {
      RVar4 = ref_export_bin_ugrid_int((FILE *)__stream,swap,fat,ref_grid->cell[6]->n);
      if (RVar4 == 0) {
        RVar4 = ref_export_bin_ugrid_int((FILE *)__stream,swap,fat,ref_grid->cell[8]->n);
        if (RVar4 == 0) {
          RVar4 = ref_export_bin_ugrid_int((FILE *)__stream,swap,fat,ref_grid->cell[9]->n);
          if (RVar4 == 0) {
            RVar4 = ref_export_bin_ugrid_int((FILE *)__stream,swap,fat,ref_grid->cell[10]->n);
            if (RVar4 == 0) {
              RVar4 = ref_export_bin_ugrid_int((FILE *)__stream,swap,fat,ref_grid->cell[0xb]->n);
              if (RVar4 == 0) {
                uVar3 = ref_node_compact(ref_node,&o2n,&n2o);
                if (uVar3 == 0) {
                  local_b8 = ref_grid->cell;
                  local_c0 = ref_grid->cell + 8;
                  lVar12 = 0;
                  local_d0 = 8;
                  do {
                    if (ref_node->n <= lVar12) {
                      ref_export_faceid_range(ref_grid,&min_faceid,&max_faceid);
                      pRVar2 = ref_grid->cell[3];
                      uVar3 = pRVar2->node_per;
                      local_c8 = (long)(int)uVar3;
                      uVar8 = 0;
                      if (0 < (int)uVar3) {
                        uVar8 = (ulong)uVar3;
                      }
                      local_f8 = min_faceid;
                      for (RVar5 = min_faceid; RVar5 <= max_faceid; RVar5 = RVar5 + 1) {
                        for (iVar10 = 0; iVar10 < pRVar2->max; iVar10 = iVar10 + 1) {
                          RVar4 = ref_cell_nodes(pRVar2,iVar10,nodes);
                          if ((RVar4 == 0) && (nodes[local_c8] == RVar5)) {
                            uVar13 = 0;
                            while (uVar8 != uVar13) {
                              iVar11 = o2n[nodes[uVar13]];
                              nodes[uVar13] = iVar11 + 1;
                              RVar4 = ref_export_bin_ugrid_int((FILE *)__stream,swap,fat,iVar11 + 1)
                              ;
                              uVar13 = uVar13 + 1;
                              if (RVar4 != 0) {
                                pcVar9 = "c2n";
                                uVar3 = 1;
                                uVar7 = 0x65a;
                                goto LAB_0012b5c0;
                              }
                            }
                          }
                        }
                      }
                      pRVar2 = ref_grid->cell[6];
                      uVar3 = pRVar2->node_per;
                      local_c8 = (long)(int)uVar3;
                      uVar8 = 0;
                      if (0 < (int)uVar3) {
                        uVar8 = (ulong)uVar3;
                      }
                      for (local_104 = min_faceid; local_104 <= max_faceid;
                          local_104 = local_104 + 1) {
                        for (iVar10 = 0; iVar10 < pRVar2->max; iVar10 = iVar10 + 1) {
                          RVar4 = ref_cell_nodes(pRVar2,iVar10,nodes);
                          if ((RVar4 == 0) && (nodes[local_c8] == local_104)) {
                            uVar13 = 0;
                            while (uVar8 != uVar13) {
                              iVar11 = o2n[nodes[uVar13]];
                              nodes[uVar13] = iVar11 + 1;
                              RVar4 = ref_export_bin_ugrid_int((FILE *)__stream,swap,fat,iVar11 + 1)
                              ;
                              uVar13 = uVar13 + 1;
                              if (RVar4 != 0) {
                                pcVar9 = "c2n";
                                uVar3 = 1;
                                uVar7 = 0x667;
                                goto LAB_0012b5c0;
                              }
                            }
                          }
                        }
                      }
                      pRVar2 = ref_grid->cell[3];
                      iVar10 = pRVar2->node_per;
                      for (local_100 = min_faceid; local_100 <= max_faceid;
                          local_100 = local_100 + 1) {
                        for (iVar11 = 0; iVar11 < pRVar2->max; iVar11 = iVar11 + 1) {
                          RVar4 = ref_cell_nodes(pRVar2,iVar11,nodes);
                          if (((RVar4 == 0) && (nodes[iVar10] == local_100)) &&
                             (RVar4 = ref_export_bin_ugrid_int((FILE *)__stream,swap,fat,nodes[3]),
                             RVar4 != 0)) {
                            pcVar9 = "c2n";
                            uVar3 = 1;
                            uVar7 = 0x672;
                            goto LAB_0012b5c0;
                          }
                        }
                      }
                      pRVar2 = ref_grid->cell[6];
                      iVar10 = pRVar2->node_per;
                      do {
                        if (max_faceid < local_f8) {
                          do {
                            if (local_d0 == 0x10) {
                              free(n2o);
                              free(o2n);
                              fclose(__stream);
                              return 0;
                            }
                            pRVar2 = *local_c0;
                            uVar13 = 0;
                            uVar8 = (ulong)(uint)pRVar2->node_per;
                            if (pRVar2->node_per < 1) {
                              uVar8 = uVar13;
                            }
                            while (iVar10 = (int)uVar13, iVar10 < pRVar2->max) {
                              RVar4 = ref_cell_nodes(pRVar2,iVar10,nodes);
                              if (RVar4 == 0) {
                                uVar13 = 0;
                                while (uVar8 != uVar13) {
                                  iVar11 = o2n[nodes[uVar13]];
                                  nodes[uVar13] = iVar11 + 1;
                                  RVar4 = ref_export_bin_ugrid_int
                                                    ((FILE *)__stream,swap,fat,iVar11 + 1);
                                  uVar13 = uVar13 + 1;
                                  if (RVar4 != 0) {
                                    pcVar9 = "c2n";
                                    uVar3 = 1;
                                    uVar7 = 0x686;
                                    goto LAB_0012b5c0;
                                  }
                                }
                              }
                              uVar13 = (ulong)(iVar10 + 1);
                            }
                            local_c0 = local_b8 + local_d0 + 1;
                            local_d0 = local_d0 + 1;
                          } while( true );
                        }
                        for (iVar11 = 0; iVar11 < pRVar2->max; iVar11 = iVar11 + 1) {
                          RVar4 = ref_cell_nodes(pRVar2,iVar11,nodes);
                          if (((RVar4 == 0) && (nodes[iVar10] == local_f8)) &&
                             (RVar4 = ref_export_bin_ugrid_int((FILE *)__stream,swap,fat,nodes[4]),
                             RVar4 != 0)) {
                            pcVar9 = "c2n";
                            uVar3 = 1;
                            uVar7 = 0x67c;
                            goto LAB_0012b5c0;
                          }
                        }
                        local_f8 = local_f8 + 1;
                      } while( true );
                    }
                    RVar1 = ref_node->real[(long)n2o[lVar12] * 0xf];
                    local_e8 = (REF_DBL)((ulong)RVar1 >> 0x38 |
                                         ((ulong)RVar1 & 0xff000000000000) >> 0x28 |
                                         ((ulong)RVar1 & 0xff0000000000) >> 0x18 |
                                         ((ulong)RVar1 & 0xff00000000) >> 8 |
                                         ((ulong)RVar1 & 0xff000000) << 8 |
                                         ((ulong)RVar1 & 0xff0000) << 0x18 |
                                         ((ulong)RVar1 & 0xff00) << 0x28 | (long)RVar1 << 0x38);
                    if (swap == 0) {
                      local_e8 = RVar1;
                    }
                    sVar6 = fwrite(&local_e8,8,1,__stream);
                    if (sVar6 != 1) {
                      pcVar9 = "x";
                      uVar7 = 0x648;
                      goto LAB_0012b84d;
                    }
                    RVar1 = ref_node->real[(long)n2o[lVar12] * 0xf + 1];
                    local_e8 = (REF_DBL)((ulong)RVar1 >> 0x38 |
                                         ((ulong)RVar1 & 0xff000000000000) >> 0x28 |
                                         ((ulong)RVar1 & 0xff0000000000) >> 0x18 |
                                         ((ulong)RVar1 & 0xff00000000) >> 8 |
                                         ((ulong)RVar1 & 0xff000000) << 8 |
                                         ((ulong)RVar1 & 0xff0000) << 0x18 |
                                         ((ulong)RVar1 & 0xff00) << 0x28 | (long)RVar1 << 0x38);
                    if (swap == 0) {
                      local_e8 = RVar1;
                    }
                    sVar6 = fwrite(&local_e8,8,1,__stream);
                    if (sVar6 != 1) {
                      pcVar9 = "y";
                      uVar7 = 0x64b;
                      goto LAB_0012b84d;
                    }
                    RVar1 = ref_node->real[(long)n2o[lVar12] * 0xf + 2];
                    local_e8 = (REF_DBL)((ulong)RVar1 >> 0x38 |
                                         ((ulong)RVar1 & 0xff000000000000) >> 0x28 |
                                         ((ulong)RVar1 & 0xff0000000000) >> 0x18 |
                                         ((ulong)RVar1 & 0xff00000000) >> 8 |
                                         ((ulong)RVar1 & 0xff000000) << 8 |
                                         ((ulong)RVar1 & 0xff0000) << 0x18 |
                                         ((ulong)RVar1 & 0xff00) << 0x28 | (long)RVar1 << 0x38);
                    if (swap == 0) {
                      local_e8 = RVar1;
                    }
                    sVar6 = fwrite(&local_e8,8,1,__stream);
                    lVar12 = lVar12 + 1;
                  } while (sVar6 == 1);
                  pcVar9 = "z";
                  uVar7 = 0x64e;
LAB_0012b84d:
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,uVar7,"ref_export_bin_ugrid",pcVar9,1,sVar6);
                  goto LAB_0012b3b4;
                }
                pcVar9 = "compact";
                uVar7 = 0x643;
              }
              else {
                pcVar9 = "nhex";
                uVar3 = 1;
                uVar7 = 0x641;
              }
            }
            else {
              pcVar9 = "npri";
              uVar3 = 1;
              uVar7 = 0x63e;
            }
          }
          else {
            pcVar9 = "npyr";
            uVar3 = 1;
            uVar7 = 0x63b;
          }
        }
        else {
          pcVar9 = "ntet";
          uVar3 = 1;
          uVar7 = 0x638;
        }
      }
      else {
        pcVar9 = "nqua";
        uVar3 = 1;
        uVar7 = 0x635;
      }
    }
    else {
      pcVar9 = "ntri";
      uVar3 = 1;
      uVar7 = 0x632;
    }
LAB_0012b5c0:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar7,
           "ref_export_bin_ugrid",(ulong)uVar3,pcVar9);
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x62f,
           "ref_export_bin_ugrid",(ulong)uVar3,"nnode");
LAB_0012b3b4:
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_export_bin_ugrid(REF_GRID ref_grid,
                                               const char *filename,
                                               REF_BOOL swap, REF_BOOL fat) {
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per, cell;
  REF_DBL swapped_dbl;
  REF_INT group;
  REF_INT faceid, min_faceid, max_faceid;

  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RSS(ref_export_bin_ugrid_int(file, swap, fat, ref_node_n(ref_node)), "nnode");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_tri(ref_grid))),
      "ntri");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_qua(ref_grid))),
      "nqua");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_tet(ref_grid))),
      "ntet");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_pyr(ref_grid))),
      "npyr");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_pri(ref_grid))),
      "npri");
  RSS(ref_export_bin_ugrid_int(file, swap, fat,
                               ref_cell_n(ref_grid_hex(ref_grid))),
      "nhex");

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  for (node = 0; node < ref_node_n(ref_node); node++) {
    swapped_dbl = ref_node_xyz(ref_node, 0, n2o[node]);
    if (swap) SWAP_DBL(swapped_dbl);
    REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "x");
    swapped_dbl = ref_node_xyz(ref_node, 1, n2o[node]);
    if (swap) SWAP_DBL(swapped_dbl);
    REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "y");
    swapped_dbl = ref_node_xyz(ref_node, 2, n2o[node]);
    if (swap) SWAP_DBL(swapped_dbl);
    REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "z");
  }

  RSS(ref_export_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        for (node = 0; node < node_per; node++) {
          nodes[node] = o2n[nodes[node]] + 1;
          RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[node]), "c2n");
        }
      }
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        for (node = 0; node < node_per; node++) {
          nodes[node] = o2n[nodes[node]] + 1;
          RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[node]), "c2n");
        }
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[3]), "c2n");
      }
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[4]), "c2n");
      }
    }
  }

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    node_per = ref_cell_node_per(ref_cell);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      for (node = 0; node < node_per; node++) {
        nodes[node] = o2n[nodes[node]] + 1;
        RSS(ref_export_bin_ugrid_int(file, swap, fat, nodes[node]), "c2n");
      }
    }
  }

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}